

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O1

hugeint_t __thiscall
duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>::
Operation<duckdb::uhugeint_t,duckdb::hugeint_t>
          (VectorDecimalCastOperator<duckdb::TryCastToDecimal> *this,uhugeint_t input,
          ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  uhugeint_t input_00;
  hugeint_t hVar2;
  hugeint_t result_value;
  uint8_t in_stack_ffffffffffffffa8;
  undefined1 auStack_57 [15];
  string local_48;
  
  input_00.lower = input.lower;
  input_00.upper = (uint64_t)&stack0xffffffffffffffa8;
  bVar1 = TryCastToDecimal::Operation<duckdb::uhugeint_t,duckdb::hugeint_t>
                    ((TryCastToDecimal *)this,input_00,*(hugeint_t **)(idx + 8),
                     (CastParameters *)(ulong)*(byte *)(idx + 0x18),*(uint8_t *)(idx + 0x19),
                     in_stack_ffffffffffffffa8);
  if (bVar1) {
    hVar2._1_15_ = auStack_57;
    hVar2.lower._0_1_ = in_stack_ffffffffffffffa8;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Failed to cast decimal value","");
    hVar2 = HandleVectorCastError::Operation<duckdb::hugeint_t>
                      (&local_48,(ValidityMask *)input.upper,(idx_t)mask,(VectorTryCastData *)idx);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return hVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorDecimalCastData *>(dataptr);
		RESULT_TYPE result_value;
		if (!OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, result_value, data->vector_cast_data.parameters,
		                                                     data->width, data->scale)) {
			return HandleVectorCastError::Operation<RESULT_TYPE>("Failed to cast decimal value", mask, idx,
			                                                     data->vector_cast_data);
		}
		return result_value;
	}